

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O3

BasicBlock * __thiscall
spvtools::opt::LoopPeeling::CreateBlockBefore(LoopPeeling *this,BasicBlock *bb)

{
  pointer *ppuVar1;
  LoopDescriptor *pLVar2;
  Loop *this_00;
  pointer pOVar3;
  uint **ppuVar4;
  Function *pFVar5;
  PodType *pPVar6;
  BasicBlock *pBVar7;
  undefined8 uVar8;
  bool bVar9;
  char cVar10;
  Analysis AVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar14;
  Instruction *pIVar15;
  const_iterator cVar16;
  mapped_type *ppLVar17;
  mapped_type *ppBVar18;
  BasicBlock *pBVar19;
  uint **ppuVar20;
  Operand *operand;
  IRContext *this_01;
  pointer pOVar21;
  Instruction *pIVar22;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Var23;
  LoopPeeling *pLVar24;
  IRContext *pIVar25;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> UVar26;
  string message;
  size_type __dnew;
  Function *local_b0;
  undefined1 local_a8 [32];
  BasicBlock *local_88;
  LoopPeeling *local_80;
  IRContext *local_78;
  undefined1 local_70 [32];
  DefUseManager *pDStack_50;
  pointer local_48;
  code *local_40;
  
  pIVar25 = this->context_;
  AVar11 = pIVar25->valid_analyses_;
  this_01 = pIVar25;
  if ((AVar11 & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar25);
    this_01 = this->context_;
    AVar11 = this_01->valid_analyses_;
  }
  local_70._16_8_ =
       (pIVar25->def_use_mgr_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  if ((AVar11 & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(this_01);
  }
  pIVar25 = (IRContext *)
            (this_01->cfg_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t
            .super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
            super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  pIVar15 = (bb->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar12 = 0;
  if (pIVar15->has_result_id_ == true) {
    uVar12 = Instruction::GetSingleWordOperand(pIVar15,(uint)pIVar15->has_type_id_);
  }
  local_88 = bb;
  local_78 = pIVar25;
  pvVar14 = CFG::preds((CFG *)pIVar25,uVar12);
  if ((long)(pvVar14->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pvVar14->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start != 4) {
    __assert_fail("cfg.preds(bb->id()).size() == 1 && \"More than one predecessor\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp"
                  ,0x15d,"BasicBlock *spvtools::opt::LoopPeeling::CreateBlockBefore(BasicBlock *)");
  }
  pIVar15 = (Instruction *)operator_new(0x70);
  pIVar25 = this->context_;
  local_80 = this;
  uVar12 = Module::TakeNextIdBound
                     ((pIVar25->module_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                      .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((uVar12 == 0) && ((pIVar25->consumer_).super__Function_base._M_manager != (_Manager_type)0x0))
  {
    local_a8._0_8_ = (long)local_a8 + 0x10;
    local_70._24_8_ = (Instruction *)0x25;
    local_a8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_a8,(ulong)(local_70 + 0x18));
    local_a8._16_8_ = local_70._24_8_;
    *(undefined8 *)local_a8._0_8_ = 0x667265766f204449;
    ((OperandData *)(local_a8._0_8_ + 8))->_vptr_SmallVector = (_func_int **)0x797254202e776f6c;
    *(undefined8 *)(local_a8._0_8_ + 0x10) = 0x676e696e6e757220;
    pPVar6 = (PodType *)(local_a8._0_8_ + 0x18);
    builtin_strncpy((pPVar6->data)._M_elems," com",4);
    pPVar6[1].data._M_elems[0] = 'p';
    pPVar6[1].data._M_elems[1] = 'a';
    pPVar6[1].data._M_elems[2] = 'c';
    pPVar6[1].data._M_elems[3] = 't';
    *(undefined8 *)(local_a8._0_8_ + 0x1d) = 0x2e7364692d746361;
    local_a8._8_8_ = local_70._24_8_;
    *(char *)((long)&((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_70._24_8_)->
                     _vptr_IntrusiveNodeBase + local_a8._0_8_) = '\0';
    local_70._24_8_ = (BasicBlock *)0x0;
    pDStack_50 = (DefUseManager *)0x0;
    local_48 = (pointer)0x0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(&pIVar25->consumer_,SPV_MSG_ERROR,"",(spv_position_t *)(local_70 + 0x18),
               (char *)local_a8._0_8_);
    if (local_a8._0_8_ != (long)local_a8 + 0x10) {
      operator_delete((void *)local_a8._0_8_,
                      (ulong)((long)&((IntrusiveNodeBase<spvtools::opt::Instruction> *)
                                     local_a8._16_8_)->_vptr_IntrusiveNodeBase + 1));
    }
  }
  local_a8._0_8_ =
       (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        )0x0;
  local_a8._8_8_ = (pointer)0x0;
  uVar13 = 0;
  local_a8._16_8_ = (Instruction *)0x0;
  Instruction::Instruction
            (pIVar15,pIVar25,OpLabel,0,uVar12,
             (vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_a8);
  local_b0 = (Function *)operator_new(0x88);
  (local_b0->def_inst_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
  (((_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
     *)&(local_b0->params_).
        super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start)->
  super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>)._M_head_impl = pIVar15;
  ppuVar1 = &(local_b0->params_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_b0->params_).
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&PTR__Instruction_009309d8;
  *(undefined4 *)
   &(local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
    context_ = 0;
  (local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = (Instruction *)0x0;
  *(undefined8 *)
   ((long)&(local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ + 6) = 0;
  (local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  opcode_ = OpNop;
  (local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  has_type_id_ = false;
  (local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  has_result_id_ = false;
  *(undefined2 *)
   &(local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
    field_0x2e = 0;
  *(undefined8 *)
   &(local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
    unique_id_ = 0;
  (local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  operands_.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.operands_.
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.operands_.
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  dbg_line_insts_.
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.dbg_line_insts_.
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  (local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
  _vptr_IntrusiveList = (_func_int **)ppuVar1;
  (local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
       (_func_int **)ppuVar1;
  *(bool *)&(local_b0->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
            sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = true;
  (local_b0->params_).
  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)&PTR__InstructionList_00930a70;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_a8);
  pLVar24 = local_80;
  pBVar7 = local_88;
  pLVar2 = (local_80->loop_utils_).loop_desc_;
  pIVar15 = (local_88->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar15->has_result_id_ == true) {
    uVar13 = Instruction::GetSingleWordOperand(pIVar15,(uint)pIVar15->has_type_id_);
  }
  local_a8._0_4_ = uVar13;
  cVar16 = std::
           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&(pLVar2->basic_block_to_loop_)._M_h,(key_type *)local_a8);
  if ((cVar16.super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_false>
       ._M_cur != (__node_type *)0x0) &&
     (this_00 = *(Loop **)((long)cVar16.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_false>
                                 ._M_cur + 0x10), this_00 != (Loop *)0x0)) {
    Loop::AddBasicBlock(this_00,(BasicBlock *)local_b0);
    pLVar2 = (pLVar24->loop_utils_).loop_desc_;
    pIVar15 = (((_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 *)&(local_b0->params_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
              super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>)._M_head_impl;
    uVar12 = 0;
    if (pIVar15->has_result_id_ == true) {
      uVar12 = Instruction::GetSingleWordOperand(pIVar15,(uint)pIVar15->has_type_id_);
    }
    local_a8._0_4_ = uVar12;
    ppLVar17 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Loop_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Loop_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&pLVar2->basic_block_to_loop_,(key_type *)local_a8);
    *ppLVar17 = this_00;
  }
  pFVar5 = local_b0;
  _Var23._M_head_impl =
       (((_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
          *)&(local_b0->params_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
       super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>)._M_head_impl;
  local_a8._0_8_ = _Var23._M_head_impl;
  if ((pLVar24->context_->valid_analyses_ & kAnalysisInstrToBlockMapping) != kAnalysisNone) {
    ppBVar18 = std::__detail::
               _Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<spvtools::opt::Instruction_*,_std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_spvtools::opt::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&pLVar24->context_->instr_to_block_,(key_type *)local_a8);
    *ppBVar18 = (mapped_type)pFVar5;
    _Var23._M_head_impl =
         (((_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            *)&(local_b0->params_).
               super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
         super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>)._M_head_impl;
  }
  analysis::DefUseManager::AnalyzeInstDefUse((DefUseManager *)local_70._16_8_,_Var23._M_head_impl);
  pIVar25 = local_78;
  pIVar15 = (pBVar7->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar12 = 0;
  if (pIVar15->has_result_id_ == true) {
    uVar12 = Instruction::GetSingleWordOperand(pIVar15,(uint)pIVar15->has_type_id_);
  }
  pvVar14 = CFG::preds((CFG *)pIVar25,uVar12);
  pBVar19 = CFG::block((CFG *)pIVar25,
                       *(pvVar14->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start);
  pIVar15 = (pBVar19->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if ((pIVar15 == (Instruction *)0x0) ||
     ((pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false))
  goto LAB_005e2a5f;
  pIVar15 = (pBVar19->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
  _Var23._M_head_impl = (Instruction *)(local_70 + 0x18);
  local_70._24_8_ = pBVar7;
  pDStack_50 = (DefUseManager *)&local_b0;
  local_40 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:366:32)>
             ::_M_invoke;
  local_48 = (pointer)std::
                      _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:366:32)>
                      ::_M_manager;
  local_a8._8_8_ = (pointer)0x0;
  local_a8._24_8_ =
       std::
       _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
       ::_M_invoke;
  local_a8._16_8_ =
       std::
       _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
       ::_M_manager;
  pOVar21 = (pIVar15->operands_).
            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pOVar3 = (pIVar15->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_a8._0_8_ = _Var23._M_head_impl;
  if (pOVar21 == pOVar3) {
LAB_005e276e:
    (*(code *)local_a8._16_8_)(local_a8,local_a8,3);
  }
  else {
    do {
      bVar9 = spvIsInIdType(pOVar21->type);
      if (bVar9) {
        ppuVar4 = (uint **)(pOVar21->words).large_data_._M_t.
                           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl;
        ppuVar20 = &(pOVar21->words).small_data_;
        if (ppuVar4 != (uint **)0x0) {
          ppuVar20 = ppuVar4;
        }
        local_70._8_8_ = *ppuVar20;
        if ((Instruction *)local_a8._16_8_ == (Instruction *)0x0) goto LAB_005e2a5a;
        cVar10 = (*(code *)local_a8._24_8_)(local_a8,local_70 + 8);
        if (cVar10 == '\0') break;
      }
      pOVar21 = pOVar21 + 1;
    } while (pOVar21 != pOVar3);
    pLVar24 = local_80;
    pIVar25 = local_78;
    if ((Instruction *)local_a8._16_8_ != (Instruction *)0x0) goto LAB_005e276e;
  }
  if (local_48 != (pointer)0x0) {
    (*(code *)local_48)(local_70 + 0x18,local_70 + 0x18,3);
  }
  pIVar15 = (pBVar19->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar13 = 0;
  uVar12 = 0;
  if (pIVar15->has_result_id_ == true) {
    uVar12 = Instruction::GetSingleWordOperand(pIVar15,(uint)pIVar15->has_type_id_);
  }
  pIVar15 = (local_88->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar15->has_result_id_ == true) {
    uVar13 = Instruction::GetSingleWordOperand(pIVar15,(uint)pIVar15->has_type_id_);
  }
  CFG::RemoveEdge((CFG *)pIVar25,uVar12,uVar13);
  pIVar15 = (pBVar19->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar13 = 0;
  uVar12 = 0;
  if (pIVar15->has_result_id_ == true) {
    uVar12 = Instruction::GetSingleWordOperand(pIVar15,(uint)pIVar15->has_type_id_);
  }
  pIVar15 = (((_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               *)&(local_b0->params_).
                  super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
            super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>)._M_head_impl;
  if (pIVar15->has_result_id_ == true) {
    uVar13 = Instruction::GetSingleWordOperand(pIVar15,(uint)pIVar15->has_type_id_);
  }
  CFG::AddEdge((CFG *)pIVar25,uVar12,uVar13);
  uVar8 = local_70._16_8_;
  pIVar15 = (pBVar19->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if ((pIVar15 == (Instruction *)0x0) ||
     ((pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
LAB_005e2a5f:
    __assert_fail("!insts_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                  ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
  }
  analysis::DefUseManager::AnalyzeInstUse
            ((DefUseManager *)local_70._16_8_,
             (pBVar19->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_);
  pBVar7 = local_88;
  local_70._24_8_ = &local_b0;
  pDStack_50 = (DefUseManager *)uVar8;
  local_40 = std::
             _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:376:22)>
             ::_M_invoke;
  local_48 = (pointer)std::
                      _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp:376:22)>
                      ::_M_manager;
  local_a8._8_8_ = (pointer)0x0;
  local_a8._24_8_ =
       std::
       _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:332:7)>
       ::_M_invoke;
  local_a8._16_8_ =
       std::
       _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:332:7)>
       ::_M_manager;
  pIVar15 = (local_88->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  local_a8._0_8_ = _Var23._M_head_impl;
  if ((pIVar15 != (Instruction *)0x0) &&
     ((pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
    do {
      if (pIVar15 == (Instruction *)0x0) break;
      pIVar22 = (pIVar15->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      if ((pIVar22->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
        pIVar22 = (Instruction *)0x0;
      }
      if (pIVar15->opcode_ != OpPhi) break;
      local_70._8_8_ = pIVar15;
      if ((Instruction *)local_a8._16_8_ == (Instruction *)0x0) {
LAB_005e2a5a:
        std::__throw_bad_function_call();
      }
      cVar10 = (*(code *)local_a8._24_8_)(local_a8,local_70 + 8);
      pIVar15 = pIVar22;
    } while (cVar10 != '\0');
    pLVar24 = local_80;
    pIVar25 = local_78;
    if ((Instruction *)local_a8._16_8_ == (Instruction *)0x0) goto LAB_005e290c;
  }
  (*(code *)local_a8._16_8_)(local_a8,local_a8,3);
LAB_005e290c:
  if (local_48 != (pointer)0x0) {
    (*(code *)local_48)(local_70 + 0x18,local_70 + 0x18,3);
  }
  local_a8._0_8_ = pLVar24->context_;
  local_a8._8_8_ = local_b0;
  local_a8._16_8_ =
       &(local_b0->params_).
        super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_a8._24_4_ = 4.2039e-45;
  pIVar15 = (pBVar7->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar13 = 0;
  uVar12 = 0;
  if (pIVar15->has_result_id_ == true) {
    uVar12 = Instruction::GetSingleWordOperand(pIVar15,(uint)pIVar15->has_type_id_);
  }
  InstructionBuilder::AddBranch((InstructionBuilder *)local_a8,uVar12);
  CFG::RegisterBlock((CFG *)pIVar25,(BasicBlock *)local_b0);
  pFVar5 = (pLVar24->loop_utils_).function_;
  pIVar15 = (local_88->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar15->has_result_id_ == true) {
    uVar13 = Instruction::GetSingleWordOperand(pIVar15,(uint)pIVar15->has_type_id_);
  }
  UVar26 = std::
           __find_if<spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,false>,__gnu_cxx::__ops::_Iter_pred<spvtools::opt::Function::FindBlock(unsigned_int)::_lambda(spvtools::opt::BasicBlock_const&)_1_>>
                     (&pFVar5->blocks_,
                      (pFVar5->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,&pFVar5->blocks_,
                      (pFVar5->blocks_).
                      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,uVar13);
  pFVar5 = local_b0;
  _Var23._M_head_impl = (Instruction *)(pLVar24->loop_utils_).function_;
  if ((UVar26.container_ ==
       (vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
        *)((long)(_Var23._M_head_impl + 1) + 0x28U)) &&
     ((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *)
      UVar26.iterator_._M_current == *(pointer *)((long)(_Var23._M_head_impl + 1) + 0x30))) {
    __assert_fail("it != loop_utils_.GetFunction()->end() && \"Basic block not found in the function.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_peeling.cpp"
                  ,0x185,"BasicBlock *spvtools::opt::LoopPeeling::CreateBlockBefore(BasicBlock *)");
  }
  local_b0 = (Function *)0x0;
  (pFVar5->def_inst_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = _Var23._M_head_impl;
  local_a8._0_8_ = pFVar5;
  local_70._0_8_ = (BasicBlock *)0x0;
  std::
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  ::_M_insert_rval(UVar26.container_,
                   (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    *)UVar26.iterator_._M_current,(value_type *)local_a8);
  if ((Instruction *)local_a8._0_8_ != (Instruction *)0x0) {
    std::default_delete<spvtools::opt::BasicBlock>::operator()
              ((default_delete<spvtools::opt::BasicBlock> *)local_a8,(BasicBlock *)local_a8._0_8_);
  }
  if ((BasicBlock *)local_70._0_8_ != (BasicBlock *)0x0) {
    std::default_delete<spvtools::opt::BasicBlock>::operator()
              ((default_delete<spvtools::opt::BasicBlock> *)local_70,(BasicBlock *)local_70._0_8_);
  }
  local_70._0_8_ = 0;
  if (local_b0 != (Function *)0x0) {
    std::default_delete<spvtools::opt::BasicBlock>::operator()
              ((default_delete<spvtools::opt::BasicBlock> *)&local_b0,(BasicBlock *)local_b0);
  }
  return (BasicBlock *)pFVar5;
}

Assistant:

BasicBlock* LoopPeeling::CreateBlockBefore(BasicBlock* bb) {
  analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();
  CFG& cfg = *context_->cfg();
  assert(cfg.preds(bb->id()).size() == 1 && "More than one predecessor");

  // TODO(1841): Handle id overflow.
  std::unique_ptr<BasicBlock> new_bb =
      MakeUnique<BasicBlock>(std::unique_ptr<Instruction>(new Instruction(
          context_, spv::Op::OpLabel, 0, context_->TakeNextId(), {})));
  // Update the loop descriptor.
  Loop* in_loop = (*loop_utils_.GetLoopDescriptor())[bb];
  if (in_loop) {
    in_loop->AddBasicBlock(new_bb.get());
    loop_utils_.GetLoopDescriptor()->SetBasicBlockToLoop(new_bb->id(), in_loop);
  }

  context_->set_instr_block(new_bb->GetLabelInst(), new_bb.get());
  def_use_mgr->AnalyzeInstDefUse(new_bb->GetLabelInst());

  BasicBlock* bb_pred = cfg.block(cfg.preds(bb->id())[0]);
  bb_pred->tail()->ForEachInId([bb, &new_bb](uint32_t* id) {
    if (*id == bb->id()) {
      *id = new_bb->id();
    }
  });
  cfg.RemoveEdge(bb_pred->id(), bb->id());
  cfg.AddEdge(bb_pred->id(), new_bb->id());
  def_use_mgr->AnalyzeInstUse(&*bb_pred->tail());

  // Update the incoming branch.
  bb->ForEachPhiInst([&new_bb, def_use_mgr](Instruction* phi) {
    phi->SetInOperand(1, {new_bb->id()});
    def_use_mgr->AnalyzeInstUse(phi);
  });
  InstructionBuilder(
      context_, new_bb.get(),
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping)
      .AddBranch(bb->id());
  cfg.RegisterBlock(new_bb.get());

  // Add the basic block to the function.
  Function::iterator it = loop_utils_.GetFunction()->FindBlock(bb->id());
  assert(it != loop_utils_.GetFunction()->end() &&
         "Basic block not found in the function.");
  BasicBlock* ret = new_bb.get();
  loop_utils_.GetFunction()->AddBasicBlock(std::move(new_bb), it);
  return ret;
}